

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

size_t llvm::getDefaultPrecision(FloatStyle Style)

{
  return (ulong)(Style < Fixed) * 4 + 2;
}

Assistant:

size_t llvm::getDefaultPrecision(FloatStyle Style) {
  switch (Style) {
  case FloatStyle::Exponent:
  case FloatStyle::ExponentUpper:
    return 6; // Number of decimal places.
  case FloatStyle::Fixed:
  case FloatStyle::Percent:
    return 2; // Number of decimal places.
  }
  LLVM_BUILTIN_UNREACHABLE;
}